

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::SetValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *m;
  TemplateString TVar1;
  TemplateString value_00;
  TemplateString local_50;
  char *local_30;
  size_t local_28;
  bool local_20;
  undefined7 uStack_1f;
  TemplateId local_18;
  TemplateDictionary *local_10;
  TemplateDictionary *this_local;
  
  TVar1 = variable;
  local_10 = this;
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->variable_dict_);
  m = this->variable_dict_;
  local_30 = variable.ptr_;
  local_28 = variable.length_;
  local_20 = variable.is_immutable_;
  uStack_1f = variable._17_7_;
  variable.id_ = TVar1.id_;
  local_18 = variable.id_;
  Memdup(&local_50,this,&value);
  TVar1.length_ = local_28;
  TVar1.ptr_ = local_30;
  TVar1.is_immutable_ = local_20;
  TVar1._17_7_ = uStack_1f;
  TVar1.id_ = local_18;
  value_00.length_ = local_50.length_;
  value_00.ptr_ = local_50.ptr_;
  value_00.is_immutable_ = local_50.is_immutable_;
  value_00._17_7_ = local_50._17_7_;
  value_00.id_ = local_50.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
            (m,TVar1,value_00);
  return;
}

Assistant:

void TemplateDictionary::SetValue(const TemplateString variable,
                                  const TemplateString value) {
  LazilyCreateDict(&variable_dict_);
  HashInsert(variable_dict_, variable, Memdup(value));
}